

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::EndSection(XmlReporter *this,string *param_1,Counts *assertions)

{
  int iVar1;
  allocator local_a4;
  allocator local_a3;
  allocator local_a2;
  allocator local_a1;
  undefined1 local_a0 [8];
  string local_98;
  string local_78;
  string local_58;
  string local_38 [32];
  
  iVar1 = this->m_sectionDepth;
  this->m_sectionDepth = iVar1 + -1;
  if (1 < iVar1) {
    std::__cxx11::string::string(local_38,"OverallResults",&local_a1);
    XmlWriter::scopedElement((XmlWriter *)local_a0,(string *)&this->m_xml);
    std::__cxx11::string::string((string *)&local_58,"successes",&local_a2);
    XmlWriter::writeAttribute<unsigned_long>((XmlWriter *)local_a0,&local_58,&assertions->passed);
    std::__cxx11::string::string((string *)&local_78,"failures",&local_a3);
    XmlWriter::writeAttribute<unsigned_long>((XmlWriter *)local_a0,&local_78,&assertions->failed);
    std::__cxx11::string::string((string *)(local_a0 + 8),"expectedFailures",&local_a4);
    XmlWriter::writeAttribute<unsigned_long>
              ((XmlWriter *)local_a0,(string *)(local_a0 + 8),&assertions->failedButOk);
    std::__cxx11::string::~string((string *)(local_a0 + 8));
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a0);
    std::__cxx11::string::~string(local_38);
    XmlWriter::endElement(&this->m_xml);
  }
  return;
}

Assistant:

virtual void EndSection( const std::string& /*sectionName*/, const Counts& assertions ) {
            if( --m_sectionDepth > 0 ) {
                m_xml.scopedElement( "OverallResults" )
                    .writeAttribute( "successes", assertions.passed )
                    .writeAttribute( "failures", assertions.failed )
                    .writeAttribute( "expectedFailures", assertions.failedButOk );
                m_xml.endElement();
            }
        }